

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

ExtensionRangeOptions *
google::protobuf::Arena::CreateMaybeMessage<google::protobuf::ExtensionRangeOptions>(Arena *arena)

{
  ExtensionRangeOptions *this;
  
  if (arena == (Arena *)0x0) {
    this = (ExtensionRangeOptions *)operator_new(0x48);
    ExtensionRangeOptions::ExtensionRangeOptions(this,(Arena *)0x0);
  }
  else {
    if (arena->hooks_cookie_ != (void *)0x0) {
      OnArenaAllocation(arena,(type_info *)&ExtensionRangeOptions::typeinfo,0x48);
    }
    this = (ExtensionRangeOptions *)AllocateAlignedNoHook(arena,0x48);
    ExtensionRangeOptions::ExtensionRangeOptions(this,arena);
  }
  return this;
}

Assistant:

PROTOBUF_NOINLINE PROTOBUF_NAMESPACE_ID::ExtensionRangeOptions* Arena::CreateMaybeMessage< PROTOBUF_NAMESPACE_ID::ExtensionRangeOptions >(Arena* arena) {
  return Arena::CreateMessageInternal< PROTOBUF_NAMESPACE_ID::ExtensionRangeOptions >(arena);
}